

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::
write_padded<fmt::v6::internal::arg_formatter_base<fmt::v6::buffer_range<char>,fmt::v6::internal::error_handler>::char_writer>
          (basic_writer<fmt::v6::buffer_range<char>> *this,format_specs *specs,char_writer *f)

{
  fill_t<char> *fill;
  checked_ptr<typename_buffer<char>::value_type> it;
  char *pcVar1;
  byte bVar2;
  size_t n;
  
  if ((ulong)(uint)specs->width < 2) {
    pcVar1 = reserve<fmt::v6::internal::buffer<char>,_0>
                       ((back_insert_iterator<fmt::v6::internal::buffer<char>_> *)this,1);
LAB_00124edd:
    *pcVar1 = f->value;
    return;
  }
  n = (ulong)(uint)specs->width - 1;
  fill = &specs->fill;
  it = reserve<fmt::v6::internal::buffer<char>,_0>
                 ((back_insert_iterator<fmt::v6::internal::buffer<char>_> *)this,
                  (specs->fill).size_ * n + 1);
  bVar2 = specs->field_0x9 & 0xf;
  if (bVar2 == 3) {
    it = fill<char*,char>(it,n >> 1,fill);
    *it = f->value;
    n = n - (n >> 1);
  }
  else {
    if (bVar2 == 2) {
      pcVar1 = fill<char*,char>(it,n,fill);
      goto LAB_00124edd;
    }
    *it = f->value;
  }
  fill<char*,char>(it + 1,n,fill);
  return;
}

Assistant:

void write_padded(const format_specs& specs, F&& f) {
    // User-perceived width (in code points).
    unsigned width = to_unsigned(specs.width);
    size_t size = f.size();  // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points) return f(reserve(size));
    size_t padding = width - num_code_points;
    size_t fill_size = specs.fill.size();
    auto&& it = reserve(size + padding * fill_size);
    if (specs.align == align::right) {
      it = fill(it, padding, specs.fill);
      f(it);
    } else if (specs.align == align::center) {
      std::size_t left_padding = padding / 2;
      it = fill(it, left_padding, specs.fill);
      f(it);
      it = fill(it, padding - left_padding, specs.fill);
    } else {
      f(it);
      it = fill(it, padding, specs.fill);
    }
  }